

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::SerializerTest_shouldSerializeLocaleIndependent_Test::TestBody
          (SerializerTest_shouldSerializeLocaleIndependent_Test *this)

{
  _Alloc_hider __p;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  char *message;
  AssertHelper local_90;
  unique_ptr<RAIILocale,_std::default_delete<RAIILocale>_> localeWithCommaDecimalSeparator;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  AssertionResult gtest_ar;
  string serialized;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  localeWithCommaDecimalSeparator._M_t.
  super___uniq_ptr_impl<RAIILocale,_std::default_delete<RAIILocale>_>._M_t.
  super__Tuple_impl<0UL,_RAIILocale_*,_std::default_delete<RAIILocale>_>.
  super__Head_base<0UL,_RAIILocale_*,_false>._M_head_impl =
       (__uniq_ptr_data<RAIILocale,_std::default_delete<RAIILocale>,_true,_true>)
       (__uniq_ptr_impl<RAIILocale,_std::default_delete<RAIILocale>_>)0x0;
  detail::make_unique<RAIILocale,char_const(&)[12]>
            ((detail *)&serialized,(char (*) [12])"de_DE.UTF-8");
  __p = serialized._M_dataplus;
  serialized._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<RAIILocale,_std::default_delete<RAIILocale>_>::reset
            ((__uniq_ptr_impl<RAIILocale,_std::default_delete<RAIILocale>_> *)
             &localeWithCommaDecimalSeparator,(pointer)__p._M_p);
  std::unique_ptr<RAIILocale,_std::default_delete<RAIILocale>_>::~unique_ptr
            ((unique_ptr<RAIILocale,_std::default_delete<RAIILocale>_> *)&serialized);
  Serializer::Serialize_abi_cxx11_
            (&serialized,&(this->super_SerializerTest).textSerializer.super_Serializer,
             &(this->super_SerializerTest).collected);
  testing::HasSubstr<char[4]>(&local_30,(StringLike<char[4]> *)0x16c7b2);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_80,(internal *)&local_30,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(&gtest_ar,(char *)&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"serialized");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_30);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)local_80.matcher_.impl_.substring_._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_80.matcher_.impl_.substring_._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&serialized);
  std::unique_ptr<RAIILocale,_std::default_delete<RAIILocale>_>::~unique_ptr
            (&localeWithCommaDecimalSeparator);
  return;
}

Assistant:

TEST_F(SerializerTest, shouldSerializeLocaleIndependent) {
  std::unique_ptr<RAIILocale> localeWithCommaDecimalSeparator;

  // ignore missing locale and skip test if setup fails
  try {
    localeWithCommaDecimalSeparator =
        detail::make_unique<RAIILocale>("de_DE.UTF-8");
  } catch (std::runtime_error&) {
    GTEST_SKIP();
  }

  const auto serialized = textSerializer.Serialize(collected);
  EXPECT_THAT(serialized, testing::HasSubstr(" 1\n"));
}